

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_convolve_ssse3.c
# Opt level: O2

void av1_highbd_convolve_y_sr_ssse3
               (uint16_t *src,int src_stride,uint16_t *dst,int dst_stride,int w,int h,
               InterpFilterParams *filter_params_y,int subpel_y_qn,int bd)

{
  uint16_t *puVar1;
  uint16_t *puVar2;
  uint16_t *puVar3;
  uint16_t *puVar4;
  uint16_t *puVar5;
  uint16_t *puVar6;
  uint16_t *puVar7;
  int16_t *piVar8;
  undefined2 *puVar9;
  undefined2 *puVar10;
  undefined1 (*pauVar11) [16];
  uint16_t uVar12;
  uint16_t uVar13;
  uint16_t uVar14;
  uint16_t uVar15;
  uint16_t uVar16;
  uint16_t uVar17;
  uint16_t uVar18;
  uint16_t uVar19;
  uint16_t uVar20;
  uint16_t uVar21;
  uint16_t uVar22;
  uint16_t uVar23;
  uint16_t uVar24;
  uint16_t uVar25;
  uint16_t uVar26;
  uint16_t uVar27;
  undefined4 uVar28;
  undefined4 uVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  uint16_t uVar35;
  uint16_t uVar36;
  uint16_t uVar37;
  uint16_t uVar38;
  uint16_t uVar39;
  uint16_t uVar40;
  uint16_t uVar41;
  uint16_t uVar42;
  uint16_t uVar43;
  uint16_t uVar44;
  uint16_t uVar45;
  uint16_t uVar46;
  uint16_t uVar47;
  uint16_t uVar48;
  uint16_t uVar49;
  uint16_t uVar50;
  uint16_t uVar51;
  uint16_t uVar52;
  uint16_t uVar53;
  uint16_t uVar54;
  uint16_t uVar55;
  uint16_t uVar56;
  uint16_t uVar57;
  uint16_t uVar58;
  uint16_t uVar59;
  uint16_t uVar60;
  uint16_t uVar61;
  uint16_t uVar62;
  uint16_t uVar63;
  uint16_t uVar64;
  uint16_t uVar65;
  uint16_t uVar66;
  uint16_t uVar67;
  uint16_t uVar68;
  uint16_t uVar69;
  uint16_t uVar70;
  uint16_t uVar71;
  uint16_t uVar72;
  uint16_t uVar73;
  uint16_t uVar74;
  uint16_t uVar75;
  uint16_t uVar76;
  uint16_t uVar77;
  uint16_t uVar78;
  uint16_t uVar79;
  uint16_t uVar80;
  uint16_t uVar81;
  uint16_t uVar82;
  uint16_t uVar83;
  uint16_t uVar84;
  uint16_t uVar85;
  uint16_t uVar86;
  uint16_t uVar87;
  uint16_t uVar88;
  uint16_t uVar89;
  uint16_t uVar90;
  uint16_t uVar91;
  uint16_t uVar92;
  uint16_t uVar93;
  uint16_t uVar94;
  long lVar95;
  uint uVar96;
  uint16_t *puVar97;
  long lVar98;
  uint16_t *puVar99;
  long lVar100;
  long lVar101;
  uint uVar102;
  long lVar103;
  long lVar104;
  int extraout_XMM0_Da;
  int extraout_XMM0_Da_00;
  int extraout_XMM0_Da_01;
  undefined8 extraout_XMM0_Qa;
  int extraout_XMM0_Dc;
  undefined1 auVar105 [16];
  int extraout_XMM0_Db;
  int extraout_XMM0_Db_00;
  int extraout_XMM0_Db_01;
  int extraout_XMM0_Dc_00;
  int extraout_XMM0_Dc_01;
  undefined8 extraout_XMM0_Qb;
  int extraout_XMM0_Dd;
  int extraout_XMM0_Dd_00;
  int extraout_XMM0_Dd_01;
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  short sVar110;
  undefined4 uVar111;
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  ushort uVar115;
  ushort uVar116;
  ushort uVar121;
  ushort uVar123;
  ushort uVar125;
  ushort uVar128;
  ushort uVar130;
  ushort uVar132;
  undefined1 auVar117 [16];
  ushort uVar122;
  ushort uVar124;
  ushort uVar126;
  short sVar127;
  ushort uVar129;
  ushort uVar131;
  ushort uVar133;
  ushort uVar134;
  ushort uVar136;
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined4 uVar137;
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined4 uVar146;
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  longlong lVar150;
  longlong lVar155;
  undefined1 auVar151 [16];
  undefined1 auVar156 [16];
  undefined1 auVar160 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  __m128i s [24];
  __m128i coeffs_y [6];
  undefined1 local_468 [16];
  undefined2 local_458;
  undefined2 uStack_456;
  undefined2 uStack_454;
  undefined2 uStack_452;
  undefined2 uStack_450;
  undefined2 uStack_44e;
  undefined2 uStack_44c;
  undefined2 uStack_44a;
  uint16_t *local_440;
  undefined1 local_428 [16];
  uint16_t local_408;
  uint16_t uStack_406;
  uint16_t uStack_404;
  uint16_t uStack_402;
  uint16_t uStack_400;
  uint16_t uStack_3fe;
  uint16_t uStack_3fc;
  uint16_t uStack_3fa;
  undefined8 local_3f8;
  undefined8 uStack_3f0;
  undefined2 uStack_3a4;
  undefined2 uStack_3a2;
  undefined2 uStack_394;
  undefined2 uStack_392;
  undefined2 uStack_384;
  undefined2 uStack_382;
  undefined2 uStack_374;
  undefined2 uStack_372;
  undefined8 local_348;
  undefined8 uStack_340;
  long local_320;
  short sStack_310;
  short sStack_30e;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 local_208;
  undefined8 uStack_200;
  uint16_t local_1f8;
  uint16_t uStack_1f6;
  uint16_t uStack_1f4;
  uint16_t uStack_1f2;
  uint16_t uStack_1f0;
  uint16_t uStack_1ee;
  uint16_t uStack_1ec;
  uint16_t uStack_1ea;
  uint16_t local_1e8;
  uint16_t uStack_1e6;
  uint16_t uStack_1e4;
  uint16_t uStack_1e2;
  uint16_t uStack_1e0;
  uint16_t uStack_1de;
  uint16_t uStack_1dc;
  uint16_t uStack_1da;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  uint16_t local_1c8;
  uint16_t uStack_1c6;
  uint16_t uStack_1c4;
  uint16_t uStack_1c2;
  uint16_t uStack_1c0;
  uint16_t uStack_1be;
  uint16_t uStack_1bc;
  uint16_t uStack_1ba;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  uint16_t local_198;
  uint16_t uStack_196;
  uint16_t uStack_194;
  uint16_t uStack_192;
  uint16_t uStack_190;
  uint16_t uStack_18e;
  uint16_t uStack_18c;
  uint16_t uStack_18a;
  uint16_t local_188;
  uint16_t uStack_186;
  uint16_t uStack_184;
  uint16_t uStack_182;
  uint16_t uStack_180;
  uint16_t uStack_17e;
  uint16_t uStack_17c;
  uint16_t uStack_17a;
  uint16_t local_178;
  uint16_t uStack_176;
  uint16_t uStack_174;
  uint16_t uStack_172;
  uint16_t uStack_170;
  uint16_t uStack_16e;
  uint16_t uStack_16c;
  uint16_t uStack_16a;
  uint16_t local_168;
  uint16_t uStack_166;
  uint16_t uStack_164;
  uint16_t uStack_162;
  uint16_t uStack_160;
  uint16_t uStack_15e;
  uint16_t uStack_15c;
  uint16_t uStack_15a;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  uint16_t local_138;
  uint16_t uStack_136;
  uint16_t uStack_134;
  uint16_t uStack_132;
  uint16_t uStack_130;
  uint16_t uStack_12e;
  uint16_t uStack_12c;
  uint16_t uStack_12a;
  uint16_t local_128;
  uint16_t uStack_126;
  uint16_t uStack_124;
  uint16_t uStack_122;
  uint16_t uStack_120;
  uint16_t uStack_11e;
  uint16_t uStack_11c;
  uint16_t uStack_11a;
  uint16_t local_118;
  uint16_t uStack_116;
  uint16_t uStack_114;
  uint16_t uStack_112;
  uint16_t uStack_110;
  uint16_t uStack_10e;
  uint16_t uStack_10c;
  uint16_t uStack_10a;
  uint16_t local_108;
  uint16_t uStack_106;
  uint16_t uStack_104;
  uint16_t uStack_102;
  uint16_t uStack_100;
  uint16_t uStack_fe;
  uint16_t uStack_fc;
  uint16_t uStack_fa;
  undefined8 local_f8;
  undefined8 uStack_f0;
  uint16_t local_e8;
  uint16_t uStack_e6;
  uint16_t uStack_e4;
  uint16_t uStack_e2;
  uint16_t uStack_e0;
  uint16_t uStack_de;
  uint16_t uStack_dc;
  uint16_t uStack_da;
  uint16_t local_d8;
  uint16_t uStack_d6;
  uint16_t uStack_d4;
  uint16_t uStack_d2;
  uint16_t uStack_d0;
  uint16_t uStack_ce;
  uint16_t uStack_cc;
  uint16_t uStack_ca;
  uint16_t local_c8;
  uint16_t uStack_c6;
  uint16_t uStack_c4;
  uint16_t uStack_c2;
  uint16_t uStack_c0;
  uint16_t uStack_be;
  uint16_t uStack_bc;
  uint16_t uStack_ba;
  uint16_t local_b8;
  uint16_t uStack_b6;
  uint16_t uStack_b4;
  uint16_t uStack_b2;
  uint16_t uStack_b0;
  uint16_t uStack_ae;
  uint16_t uStack_ac;
  uint16_t uStack_aa;
  uint16_t local_a8;
  uint16_t uStack_a6;
  uint16_t uStack_a4;
  uint16_t uStack_a2;
  uint16_t uStack_a0;
  uint16_t uStack_9e;
  uint16_t uStack_9c;
  uint16_t uStack_9a;
  longlong local_98 [13];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  short sVar135;
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar157 [16];
  undefined1 auVar161 [16];
  undefined1 auVar158 [16];
  undefined1 auVar162 [16];
  undefined1 auVar159 [16];
  undefined1 auVar163 [16];
  
  uVar115 = filter_params_y->taps;
  lVar103 = (long)(int)(((uVar115 >> 1) - 1) * src_stride);
  uVar102 = 0xff;
  if (bd == 0xc) {
    uVar102 = 0xfff;
  }
  uVar96 = 0x3ff;
  if (bd != 10) {
    uVar96 = uVar102;
  }
  auVar105 = pshuflw(ZEXT416(uVar96),ZEXT416(uVar96),0);
  sStack_310 = auVar105._0_2_;
  sStack_30e = auVar105._2_2_;
  local_440 = dst;
  if (uVar115 == 0xc) {
    prepare_coeffs_12tap(filter_params_y,subpel_y_qn,(__m128i *)local_98);
    local_320 = (long)(src_stride * 0xc) * 2 + lVar103 * -2;
    lVar98 = (long)(src_stride * 0xb) * 2 + lVar103 * -2;
    lVar95 = (long)dst_stride;
    for (lVar104 = 0; lVar104 < w; lVar104 = lVar104 + 8) {
      puVar97 = src + (lVar104 - lVar103);
      puVar99 = puVar97 + src_stride;
      puVar7 = puVar97 + src_stride * 2;
      local_408 = *puVar7;
      uStack_404 = puVar7[1];
      uStack_400 = puVar7[2];
      uStack_3fc = puVar7[3];
      local_468._0_2_ = puVar7[4];
      local_468._4_2_ = puVar7[5];
      local_468._8_2_ = puVar7[6];
      local_468._12_2_ = puVar7[7];
      puVar7 = puVar97 + src_stride * 3;
      local_3f8._0_2_ = *puVar7;
      local_3f8._4_2_ = puVar7[1];
      uStack_3f0._0_2_ = puVar7[2];
      uStack_3f0._4_2_ = puVar7[3];
      local_468._2_2_ = puVar7[4];
      local_468._6_2_ = puVar7[5];
      uStack_e0 = puVar7[6];
      uStack_dc = puVar7[7];
      puVar7 = puVar97 + src_stride * 4;
      local_3f8._2_2_ = *puVar7;
      local_3f8._6_2_ = puVar7[1];
      uStack_3f0._2_2_ = puVar7[2];
      uStack_3f0._6_2_ = puVar7[3];
      puVar1 = puVar97 + src_stride * 5;
      puVar2 = puVar97 + src_stride * 6;
      puVar3 = puVar97 + src_stride * 7;
      puVar4 = puVar97 + src_stride * 8;
      puVar5 = puVar97 + src_stride * 9;
      puVar6 = puVar97 + src_stride * 10;
      local_218 = CONCAT26(puVar99[1],CONCAT24(puVar97[1],CONCAT22(*puVar99,*puVar97)));
      uStack_210 = CONCAT26(puVar99[3],CONCAT24(puVar97[3],CONCAT22(puVar99[2],puVar97[2])));
      local_208 = CONCAT26(local_3f8._4_2_,
                           CONCAT24(uStack_404,CONCAT22((uint16_t)local_3f8,local_408)));
      uStack_200 = CONCAT26(uStack_3f0._4_2_,
                            CONCAT24(uStack_3fc,CONCAT22((uint16_t)uStack_3f0,uStack_400)));
      local_1d8 = CONCAT26(puVar5[1],CONCAT24(puVar4[1],CONCAT22(*puVar5,*puVar4)));
      uStack_1d0 = CONCAT26(puVar5[3],CONCAT24(puVar4[3],CONCAT22(puVar5[2],puVar4[2])));
      local_1b8 = CONCAT26(puVar99[5],CONCAT24(puVar97[5],CONCAT22(puVar99[4],puVar97[4])));
      uStack_1b0 = CONCAT26(puVar99[7],CONCAT24(puVar97[7],CONCAT22(puVar99[6],puVar97[6])));
      local_468._10_2_ = uStack_e0;
      local_468._14_2_ = uStack_dc;
      local_1a8 = CONCAT26(local_468._6_2_,
                           CONCAT24(local_468._4_2_,CONCAT22(local_468._2_2_,local_468._0_2_)));
      uStack_1a0 = CONCAT26(uStack_dc,CONCAT24(local_468._12_2_,CONCAT22(uStack_e0,local_468._8_2_))
                           );
      local_158 = CONCAT26(uStack_404,CONCAT24(puVar99[1],CONCAT22(local_408,*puVar99)));
      uStack_150 = CONCAT26(uStack_3fc,CONCAT24(puVar99[3],CONCAT22(uStack_400,puVar99[2])));
      local_148 = CONCAT26(local_3f8._6_2_,
                           CONCAT24(local_3f8._4_2_,CONCAT22(local_3f8._2_2_,(uint16_t)local_3f8)));
      uStack_140 = CONCAT26(uStack_3f0._6_2_,
                            CONCAT24(uStack_3f0._4_2_,
                                     CONCAT22(uStack_3f0._2_2_,(uint16_t)uStack_3f0)));
      local_f8 = CONCAT26(local_468._4_2_,CONCAT24(puVar99[5],CONCAT22(local_468._0_2_,puVar99[4])))
      ;
      uStack_f0 = CONCAT26(local_468._12_2_,
                           CONCAT24(puVar99[7],CONCAT22(local_468._8_2_,puVar99[6])));
      lVar100 = 0;
      puVar97 = src;
      puVar99 = local_440;
      uStack_406 = (uint16_t)local_3f8;
      uStack_402 = local_3f8._4_2_;
      uStack_3fe = (uint16_t)uStack_3f0;
      uStack_3fa = uStack_3f0._4_2_;
      local_1f8 = local_3f8._2_2_;
      uStack_1f4 = local_3f8._6_2_;
      uStack_1f0 = uStack_3f0._2_2_;
      uStack_1ec = uStack_3f0._6_2_;
      local_138 = *puVar1;
      uStack_136 = *puVar2;
      uStack_134 = puVar1[1];
      uStack_132 = puVar2[1];
      uStack_130 = puVar1[2];
      uStack_12e = puVar2[2];
      uStack_12c = puVar1[3];
      uStack_12a = puVar2[3];
      local_128 = *puVar3;
      uStack_126 = *puVar4;
      uStack_124 = puVar3[1];
      uStack_122 = puVar4[1];
      uStack_120 = puVar3[2];
      uStack_11e = puVar4[2];
      uStack_11c = puVar3[3];
      uStack_11a = puVar4[3];
      local_118 = *puVar5;
      uStack_116 = *puVar6;
      uStack_114 = puVar5[1];
      uStack_112 = puVar6[1];
      uStack_110 = puVar5[2];
      uStack_10e = puVar6[2];
      uStack_10c = puVar5[3];
      uStack_10a = puVar6[3];
      local_e8 = local_468._2_2_;
      uStack_e6 = puVar7[4];
      uStack_e4 = local_468._6_2_;
      uStack_e2 = puVar7[5];
      uStack_de = puVar7[6];
      uStack_da = puVar7[7];
      local_d8 = puVar1[4];
      uStack_d6 = puVar2[4];
      uStack_d4 = puVar1[5];
      uStack_d2 = puVar2[5];
      uStack_d0 = puVar1[6];
      uStack_ce = puVar2[6];
      uStack_cc = puVar1[7];
      uStack_ca = puVar2[7];
      local_c8 = puVar3[4];
      uStack_c6 = puVar4[4];
      uStack_c4 = puVar3[5];
      uStack_c2 = puVar4[5];
      uStack_c0 = puVar3[6];
      uStack_be = puVar4[6];
      uStack_bc = puVar3[7];
      uStack_ba = puVar4[7];
      local_b8 = puVar5[4];
      uStack_b6 = puVar6[4];
      uStack_b4 = puVar5[5];
      uStack_b2 = puVar6[5];
      uStack_b0 = puVar5[6];
      uStack_ae = puVar6[6];
      uStack_ac = puVar5[7];
      uStack_aa = puVar6[7];
      while( true ) {
        lVar155 = local_468._8_8_;
        lVar150 = local_468._0_8_;
        uVar94 = uStack_aa;
        uVar93 = uStack_ac;
        uVar92 = uStack_ae;
        uVar91 = uStack_b0;
        uVar90 = uStack_b2;
        uVar89 = uStack_b4;
        uVar88 = uStack_b6;
        uVar87 = local_b8;
        uVar86 = uStack_ba;
        uVar85 = uStack_bc;
        uVar84 = uStack_be;
        uVar83 = uStack_c0;
        uVar82 = uStack_c2;
        uVar81 = uStack_c4;
        uVar80 = uStack_c6;
        uVar79 = local_c8;
        uVar78 = uStack_ca;
        uVar77 = uStack_cc;
        uVar76 = uStack_ce;
        uVar75 = uStack_d0;
        uVar74 = uStack_d2;
        uVar73 = uStack_d4;
        uVar72 = uStack_d6;
        uVar71 = local_d8;
        uVar70 = uStack_da;
        uVar69 = uStack_dc;
        uVar68 = uStack_de;
        uVar67 = uStack_e0;
        uVar66 = uStack_e2;
        uVar65 = uStack_e4;
        uVar64 = uStack_e6;
        uVar63 = local_e8;
        uVar62 = uStack_10a;
        uVar61 = uStack_10c;
        uVar60 = uStack_10e;
        uVar59 = uStack_110;
        uVar58 = uStack_112;
        uVar57 = uStack_114;
        uVar56 = uStack_116;
        uVar55 = local_118;
        uVar54 = uStack_11a;
        uVar53 = uStack_11c;
        uVar52 = uStack_11e;
        uVar51 = uStack_120;
        uVar50 = uStack_122;
        uVar49 = uStack_124;
        uVar48 = uStack_126;
        uVar47 = local_128;
        uVar46 = uStack_12a;
        uVar45 = uStack_12c;
        uVar44 = uStack_12e;
        uVar43 = uStack_130;
        uVar42 = uStack_132;
        uVar41 = uStack_134;
        uVar40 = uStack_136;
        uVar39 = local_138;
        uVar38 = uStack_1ec;
        uVar37 = uStack_1f0;
        uVar36 = uStack_1f4;
        uVar35 = local_1f8;
        local_348._0_4_ = CONCAT22(local_138,local_1f8);
        local_348._0_6_ = CONCAT24(uStack_1f4,(undefined4)local_348);
        local_348 = CONCAT26(uStack_134,(undefined6)local_348);
        uStack_340._0_2_ = uStack_1f0;
        uStack_340._2_2_ = uStack_130;
        uStack_340._4_2_ = uStack_1ec;
        uStack_340._6_2_ = uStack_12c;
        if (h <= lVar100) break;
        puVar7 = (uint16_t *)((long)puVar97 + lVar98);
        uVar12 = *puVar7;
        uVar13 = puVar7[1];
        uVar14 = puVar7[2];
        uVar15 = puVar7[3];
        uVar16 = puVar7[4];
        uVar17 = puVar7[5];
        uVar18 = puVar7[6];
        uVar19 = puVar7[7];
        puVar7 = (uint16_t *)((long)puVar97 + local_320);
        uVar20 = *puVar7;
        uVar21 = puVar7[1];
        uVar22 = puVar7[2];
        uVar23 = puVar7[3];
        uVar24 = puVar7[4];
        uVar25 = puVar7[5];
        uVar26 = puVar7[6];
        uVar27 = puVar7[7];
        uStack_1f6 = local_138;
        uStack_1f2 = uStack_134;
        uStack_1ee = uStack_130;
        uStack_1ea = uStack_12c;
        local_1e8 = uStack_136;
        uStack_1e6 = local_128;
        uStack_1e4 = uStack_132;
        uStack_1e2 = uStack_124;
        uStack_1e0 = uStack_12e;
        uStack_1de = uStack_120;
        uStack_1dc = uStack_12a;
        uStack_1da = uStack_11c;
        local_1c8 = uStack_116;
        uStack_1c6 = uVar12;
        uStack_1c4 = uStack_112;
        uStack_1c2 = uVar13;
        uStack_1c0 = uStack_10e;
        uStack_1be = uVar14;
        uStack_1bc = uStack_10a;
        uStack_1ba = uVar15;
        local_198 = uStack_e6;
        uStack_196 = local_d8;
        uStack_194 = uStack_e2;
        uStack_192 = uStack_d4;
        uStack_190 = uStack_de;
        uStack_18e = uStack_d0;
        uStack_18c = uStack_da;
        uStack_18a = uStack_cc;
        local_188 = uStack_d6;
        uStack_186 = local_c8;
        uStack_184 = uStack_d2;
        uStack_182 = uStack_c4;
        uStack_180 = uStack_ce;
        uStack_17e = uStack_c0;
        uStack_17c = uStack_ca;
        uStack_17a = uStack_bc;
        local_178 = uStack_c6;
        uStack_176 = local_b8;
        uStack_174 = uStack_c2;
        uStack_172 = uStack_b4;
        uStack_170 = uStack_be;
        uStack_16e = uStack_b0;
        uStack_16c = uStack_ba;
        uStack_16a = uStack_ac;
        local_168 = uStack_b6;
        uStack_166 = uVar16;
        uStack_164 = uStack_b2;
        uStack_162 = uVar17;
        uStack_160 = uStack_ae;
        uStack_15e = uVar18;
        uStack_15c = uStack_aa;
        uStack_15a = uVar19;
        local_108 = uVar12;
        uStack_106 = uVar20;
        uStack_104 = uVar13;
        uStack_102 = uVar21;
        uStack_100 = uVar14;
        uStack_fe = uVar22;
        uStack_fc = uVar15;
        uStack_fa = uVar23;
        local_a8 = uVar16;
        uStack_a6 = uVar24;
        uStack_a4 = uVar17;
        uStack_a2 = uVar25;
        uStack_a0 = uVar18;
        uStack_9e = uVar26;
        uStack_9c = uVar19;
        uStack_9a = uVar27;
        convolve_12tap((__m128i *)&local_218,(__m128i *)local_98);
        convolve_12tap((__m128i *)&local_158,(__m128i *)local_98);
        local_428._0_4_ = (undefined4)extraout_XMM0_Qa;
        local_428._4_4_ = (undefined4)((ulong)extraout_XMM0_Qa >> 0x20);
        local_428._8_4_ = (undefined4)extraout_XMM0_Qb;
        local_428._12_4_ = (undefined4)((ulong)extraout_XMM0_Qb >> 0x20);
        auVar112._0_4_ = local_428._0_4_ + 0x40 >> 7;
        auVar112._4_4_ = local_428._4_4_ + 0x40 >> 7;
        auVar112._8_4_ = local_428._8_4_ + 0x40 >> 7;
        auVar112._12_4_ = local_428._12_4_ + 0x40 >> 7;
        auVar117._0_4_ = extraout_XMM0_Da + 0x40 >> 7;
        auVar117._4_4_ = extraout_XMM0_Db + 0x40 >> 7;
        auVar117._8_4_ = extraout_XMM0_Dc + 0x40 >> 7;
        auVar117._12_4_ = extraout_XMM0_Dd + 0x40 >> 7;
        if (lVar104 < (long)w + -4) {
          convolve_12tap((__m128i *)&local_1b8,(__m128i *)local_98);
          convolve_12tap((__m128i *)&local_f8,(__m128i *)local_98);
          auVar106._0_4_ = extraout_XMM0_Da_01 + 0x40 >> 7;
          auVar106._4_4_ = extraout_XMM0_Db_01 + 0x40 >> 7;
          auVar106._8_4_ = extraout_XMM0_Dc_01 + 0x40 >> 7;
          auVar106._12_4_ = extraout_XMM0_Dd_01 + 0x40 >> 7;
          auVar34._4_4_ = extraout_XMM0_Db_00 + 0x40 >> 7;
          auVar34._0_4_ = extraout_XMM0_Da_00 + 0x40 >> 7;
          auVar34._8_4_ = extraout_XMM0_Dc_00 + 0x40 >> 7;
          auVar34._12_4_ = extraout_XMM0_Dd_00 + 0x40 >> 7;
          auVar105 = packssdw(auVar112,auVar34);
          sVar110 = auVar105._0_2_;
          uVar115 = (ushort)(sStack_310 < sVar110) * sStack_310 |
                    (ushort)(sStack_310 >= sVar110) * sVar110;
          sVar110 = auVar105._2_2_;
          uVar121 = (ushort)(sStack_30e < sVar110) * sStack_30e |
                    (ushort)(sStack_30e >= sVar110) * sVar110;
          sVar110 = auVar105._4_2_;
          uVar123 = (ushort)(sStack_310 < sVar110) * sStack_310 |
                    (ushort)(sStack_310 >= sVar110) * sVar110;
          sVar110 = auVar105._6_2_;
          uVar125 = (ushort)(sStack_30e < sVar110) * sStack_30e |
                    (ushort)(sStack_30e >= sVar110) * sVar110;
          sVar110 = auVar105._8_2_;
          uVar128 = (ushort)(sStack_310 < sVar110) * sStack_310 |
                    (ushort)(sStack_310 >= sVar110) * sVar110;
          sVar110 = auVar105._10_2_;
          uVar130 = (ushort)(sStack_30e < sVar110) * sStack_30e |
                    (ushort)(sStack_30e >= sVar110) * sVar110;
          sVar110 = auVar105._12_2_;
          sVar135 = auVar105._14_2_;
          uVar132 = (ushort)(sStack_310 < sVar110) * sStack_310 |
                    (ushort)(sStack_310 >= sVar110) * sVar110;
          uVar134 = (ushort)(sStack_30e < sVar135) * sStack_30e |
                    (ushort)(sStack_30e >= sVar135) * sVar135;
          auVar105 = packssdw(auVar117,auVar106);
          sVar110 = auVar105._0_2_;
          uVar116 = (ushort)(sStack_310 < sVar110) * sStack_310 |
                    (ushort)(sStack_310 >= sVar110) * sVar110;
          sVar110 = auVar105._2_2_;
          uVar122 = (ushort)(sStack_30e < sVar110) * sStack_30e |
                    (ushort)(sStack_30e >= sVar110) * sVar110;
          sVar110 = auVar105._4_2_;
          uVar124 = (ushort)(sStack_310 < sVar110) * sStack_310 |
                    (ushort)(sStack_310 >= sVar110) * sVar110;
          sVar110 = auVar105._6_2_;
          uVar126 = (ushort)(sStack_30e < sVar110) * sStack_30e |
                    (ushort)(sStack_30e >= sVar110) * sVar110;
          sVar110 = auVar105._8_2_;
          uVar129 = (ushort)(sStack_310 < sVar110) * sStack_310 |
                    (ushort)(sStack_310 >= sVar110) * sVar110;
          sVar110 = auVar105._10_2_;
          uVar131 = (ushort)(sStack_30e < sVar110) * sStack_30e |
                    (ushort)(sStack_30e >= sVar110) * sVar110;
          sVar110 = auVar105._12_2_;
          sVar135 = auVar105._14_2_;
          uVar133 = (ushort)(sStack_310 < sVar110) * sStack_310 |
                    (ushort)(sStack_310 >= sVar110) * sVar110;
          uVar136 = (ushort)(sStack_30e < sVar135) * sStack_30e |
                    (ushort)(sStack_30e >= sVar135) * sVar135;
          *puVar99 = (-1 < (short)uVar115) * uVar115;
          puVar99[1] = (-1 < (short)uVar121) * uVar121;
          puVar99[2] = (-1 < (short)uVar123) * uVar123;
          puVar99[3] = (-1 < (short)uVar125) * uVar125;
          puVar99[4] = (-1 < (short)uVar128) * uVar128;
          puVar99[5] = (-1 < (short)uVar130) * uVar130;
          puVar99[6] = (-1 < (short)uVar132) * uVar132;
          puVar99[7] = (-1 < (short)uVar134) * uVar134;
          puVar7 = puVar99 + lVar95;
          *puVar7 = (-1 < (short)uVar116) * uVar116;
          puVar7[1] = (-1 < (short)uVar122) * uVar122;
          puVar7[2] = (-1 < (short)uVar124) * uVar124;
          puVar7[3] = (-1 < (short)uVar126) * uVar126;
          puVar7[4] = (-1 < (short)uVar129) * uVar129;
          puVar7[5] = (-1 < (short)uVar131) * uVar131;
          puVar7[6] = (-1 < (short)uVar133) * uVar133;
          puVar7[7] = (-1 < (short)uVar136) * uVar136;
        }
        else {
          auVar105 = packssdw(auVar112,auVar112);
          sVar110 = auVar105._0_2_;
          uVar115 = (ushort)(sStack_310 < sVar110) * sStack_310 |
                    (ushort)(sStack_310 >= sVar110) * sVar110;
          sVar110 = auVar105._2_2_;
          uVar116 = (ushort)(sStack_30e < sVar110) * sStack_30e |
                    (ushort)(sStack_30e >= sVar110) * sVar110;
          sVar110 = auVar105._4_2_;
          uVar121 = (ushort)(sStack_310 < sVar110) * sStack_310 |
                    (ushort)(sStack_310 >= sVar110) * sVar110;
          sVar110 = auVar105._6_2_;
          uVar122 = (ushort)(sStack_30e < sVar110) * sStack_30e |
                    (ushort)(sStack_30e >= sVar110) * sVar110;
          uVar111 = CONCAT22((-1 < (short)uVar116) * uVar116,(-1 < (short)uVar115) * uVar115);
          auVar105 = packssdw(auVar117,auVar117);
          sVar110 = auVar105._0_2_;
          sVar135 = auVar105._2_2_;
          sVar127 = auVar105._6_2_;
          if (w == 4) {
            uVar115 = (ushort)(sStack_310 < sVar110) * sStack_310 |
                      (ushort)(sStack_310 >= sVar110) * sVar110;
            uVar116 = (ushort)(sStack_30e < sVar135) * sStack_30e |
                      (ushort)(sStack_30e >= sVar135) * sVar135;
            sVar110 = auVar105._4_2_;
            uVar123 = (ushort)(sStack_310 < sVar110) * sStack_310 |
                      (ushort)(sStack_310 >= sVar110) * sVar110;
            uVar124 = (ushort)(sStack_30e < sVar127) * sStack_30e |
                      (ushort)(sStack_30e >= sVar127) * sVar127;
            *(ulong *)puVar99 =
                 CONCAT26((-1 < (short)uVar122) * uVar122,
                          CONCAT24((-1 < (short)uVar121) * uVar121,uVar111));
            *(ulong *)(puVar99 + lVar95) =
                 CONCAT26((-1 < (short)uVar124) * uVar124,
                          CONCAT24((-1 < (short)uVar123) * uVar123,
                                   CONCAT22((-1 < (short)uVar116) * uVar116,
                                            (-1 < (short)uVar115) * uVar115)));
          }
          else {
            uVar115 = (ushort)(sStack_310 < sVar110) * sStack_310 |
                      (ushort)(sStack_310 >= sVar110) * sVar110;
            uVar116 = (ushort)(sStack_30e < sVar135) * sStack_30e |
                      (ushort)(sStack_30e >= sVar135) * sVar135;
            *(undefined4 *)puVar99 = uVar111;
            *(uint *)(puVar99 + lVar95) =
                 CONCAT22((-1 < (short)uVar116) * uVar116,(-1 < (short)uVar115) * uVar115);
          }
        }
        local_f8 = CONCAT26(uVar66,CONCAT24(uVar65,CONCAT22(uVar64,uVar63)));
        uStack_f0 = CONCAT26(uVar70,CONCAT24(uVar69,CONCAT22(uVar68,uVar67)));
        local_1d8 = CONCAT26(uVar13,CONCAT24(uVar58,CONCAT22(uVar12,uVar56)));
        uStack_1d0 = CONCAT26(uVar15,CONCAT24(uVar62,CONCAT22(uVar14,uVar60)));
        local_218 = CONCAT26(uStack_402,CONCAT24(uStack_404,CONCAT22(uStack_406,local_408)));
        uStack_210 = CONCAT26(uStack_3fa,CONCAT24(uStack_3fc,CONCAT22(uStack_3fe,uStack_400)));
        local_208 = local_348;
        uStack_200 = uStack_340;
        local_1a8 = CONCAT26(uVar73,CONCAT24(uVar66,CONCAT22(uVar71,uVar64)));
        uStack_1a0 = CONCAT26(uVar77,CONCAT24(uVar70,CONCAT22(uVar75,uVar68)));
        local_158 = local_3f8;
        uStack_150 = uStack_3f0;
        local_148 = CONCAT26(uVar42,CONCAT24(uVar41,CONCAT22(uVar40,uVar39)));
        uStack_140 = CONCAT26(uVar46,CONCAT24(uVar45,CONCAT22(uVar44,uVar43)));
        lVar100 = lVar100 + 2;
        puVar97 = puVar97 + (long)src_stride * 2;
        puVar99 = puVar99 + lVar95 * 2;
        uStack_3f0 = uStack_140;
        local_3f8 = local_148;
        local_468._0_8_ = local_1a8;
        local_468._8_8_ = uStack_1a0;
        local_408 = uVar35;
        uStack_406 = uVar39;
        uStack_404 = uVar36;
        uStack_402 = uVar41;
        uStack_400 = uVar37;
        uStack_3fe = uVar43;
        uStack_3fc = uVar38;
        uStack_3fa = uVar45;
        local_1f8 = uVar40;
        uStack_1f4 = uVar42;
        uStack_1f0 = uVar44;
        uStack_1ec = uVar46;
        local_1b8 = lVar150;
        uStack_1b0 = lVar155;
        local_138 = uVar47;
        uStack_136 = uVar48;
        uStack_134 = uVar49;
        uStack_132 = uVar50;
        uStack_130 = uVar51;
        uStack_12e = uVar52;
        uStack_12c = uVar53;
        uStack_12a = uVar54;
        local_128 = uVar55;
        uStack_126 = uVar56;
        uStack_124 = uVar57;
        uStack_122 = uVar58;
        uStack_120 = uVar59;
        uStack_11e = uVar60;
        uStack_11c = uVar61;
        uStack_11a = uVar62;
        local_118 = uVar12;
        uStack_116 = uVar20;
        uStack_114 = uVar13;
        uStack_112 = uVar21;
        uStack_110 = uVar14;
        uStack_10e = uVar22;
        uStack_10c = uVar15;
        uStack_10a = uVar23;
        local_e8 = uVar71;
        uStack_e6 = uVar72;
        uStack_e4 = uVar73;
        uStack_e2 = uVar74;
        uStack_e0 = uVar75;
        uStack_de = uVar76;
        uStack_dc = uVar77;
        uStack_da = uVar78;
        local_d8 = uVar79;
        uStack_d6 = uVar80;
        uStack_d4 = uVar81;
        uStack_d2 = uVar82;
        uStack_d0 = uVar83;
        uStack_ce = uVar84;
        uStack_cc = uVar85;
        uStack_ca = uVar86;
        local_c8 = uVar87;
        uStack_c6 = uVar88;
        uStack_c4 = uVar89;
        uStack_c2 = uVar90;
        uStack_c0 = uVar91;
        uStack_be = uVar92;
        uStack_bc = uVar93;
        uStack_ba = uVar94;
        local_b8 = uVar16;
        uStack_b6 = uVar24;
        uStack_b4 = uVar17;
        uStack_b2 = uVar25;
        uStack_b0 = uVar18;
        uStack_ae = uVar26;
        uStack_ac = uVar19;
        uStack_aa = uVar27;
      }
      local_320 = local_320 + 0x10;
      lVar98 = lVar98 + 0x10;
      local_440 = local_440 + 8;
    }
  }
  else {
    piVar8 = filter_params_y->filter_ptr + (subpel_y_qn & 0xfU) * (uint)uVar115;
    uVar111 = *(undefined4 *)piVar8;
    uVar28 = *(undefined4 *)(piVar8 + 2);
    uVar29 = *(undefined4 *)(piVar8 + 4);
    uVar137 = *(undefined4 *)(piVar8 + 6);
    lVar95 = (long)dst_stride;
    lVar100 = (long)(src_stride * 8) * 2 + lVar103 * -2;
    lVar104 = (long)(src_stride * 7) * 2 + lVar103 * -2;
    uStack_374 = (undefined2)uVar111;
    uStack_372 = (undefined2)((uint)uVar111 >> 0x10);
    uStack_384 = (undefined2)uVar28;
    uStack_382 = (undefined2)((uint)uVar28 >> 0x10);
    uStack_394 = (undefined2)uVar29;
    uStack_392 = (undefined2)((uint)uVar29 >> 0x10);
    uStack_3a4 = (undefined2)uVar137;
    uStack_3a2 = (undefined2)((uint)uVar137 >> 0x10);
    auVar105._4_2_ = uStack_3a4;
    auVar105._0_4_ = uVar137;
    auVar105._6_2_ = uStack_3a2;
    auVar105._8_2_ = uStack_3a4;
    auVar105._10_2_ = uStack_3a2;
    auVar105._12_2_ = uStack_3a4;
    auVar105._14_2_ = uStack_3a2;
    for (lVar98 = 0; lVar98 < w; lVar98 = lVar98 + 8) {
      pauVar11 = (undefined1 (*) [16])(src + (lVar98 - lVar103));
      auVar138 = *pauVar11;
      auVar140 = *(undefined1 (*) [16])(*pauVar11 + (long)src_stride * 2);
      auVar141 = *(undefined1 (*) [16])(*pauVar11 + (long)(src_stride * 2) * 2);
      puVar9 = (undefined2 *)(*pauVar11 + (long)(src_stride * 3) * 2);
      local_458 = *puVar9;
      uStack_454 = puVar9[1];
      uStack_450 = puVar9[2];
      uStack_44c = puVar9[3];
      auVar112 = *(undefined1 (*) [16])(*pauVar11 + (long)(src_stride * 4) * 2);
      puVar10 = (undefined2 *)(*pauVar11 + (long)(src_stride * 5) * 2);
      auVar118 = *(undefined1 (*) [16])(*pauVar11 + (long)(src_stride * 6) * 2);
      auVar145._0_12_ = auVar138._0_12_;
      auVar145._12_2_ = auVar138._6_2_;
      auVar145._14_2_ = auVar140._6_2_;
      auVar148._12_4_ = auVar145._12_4_;
      auVar148._0_10_ = auVar138._0_10_;
      auVar148._10_2_ = auVar140._4_2_;
      auVar147._10_6_ = auVar148._10_6_;
      auVar147._0_8_ = auVar138._0_8_;
      auVar147._8_2_ = auVar138._4_2_;
      auVar139._8_8_ = auVar147._8_8_;
      auVar139._6_2_ = auVar140._2_2_;
      auVar139._4_2_ = auVar138._2_2_;
      auVar139._0_2_ = auVar138._0_2_;
      auVar139._2_2_ = auVar140._0_2_;
      auVar119._2_2_ = auVar140._8_2_;
      auVar119._0_2_ = auVar138._8_2_;
      auVar119._4_2_ = auVar138._10_2_;
      auVar119._6_2_ = auVar140._10_2_;
      auVar119._8_2_ = auVar138._12_2_;
      auVar119._10_2_ = auVar140._12_2_;
      auVar119._12_2_ = auVar138._14_2_;
      auVar119._14_2_ = auVar140._14_2_;
      auVar144._0_12_ = auVar140._0_12_;
      auVar144._12_2_ = auVar140._6_2_;
      auVar144._14_2_ = auVar141._6_2_;
      auVar143._12_4_ = auVar144._12_4_;
      auVar143._0_10_ = auVar140._0_10_;
      auVar143._10_2_ = auVar141._4_2_;
      auVar142._10_6_ = auVar143._10_6_;
      auVar142._0_8_ = auVar140._0_8_;
      auVar142._8_2_ = auVar140._4_2_;
      auVar138._8_8_ = auVar142._8_8_;
      auVar138._6_2_ = auVar141._2_2_;
      auVar138._4_2_ = auVar140._2_2_;
      auVar113._0_2_ = auVar141._0_2_;
      auVar138._2_2_ = auVar113._0_2_;
      auVar138._0_2_ = auVar140._0_2_;
      auVar120._2_2_ = auVar141._8_2_;
      auVar120._0_2_ = auVar140._8_2_;
      auVar120._4_2_ = auVar140._10_2_;
      auVar120._6_2_ = auVar141._10_2_;
      auVar120._8_2_ = auVar140._12_2_;
      auVar120._10_2_ = auVar141._12_2_;
      auVar120._12_2_ = auVar140._14_2_;
      auVar120._14_2_ = auVar141._14_2_;
      auVar109._0_12_ = auVar141._0_12_;
      auVar109._12_2_ = auVar141._6_2_;
      auVar109._14_2_ = uStack_44c;
      auVar108._12_4_ = auVar109._12_4_;
      auVar108._0_10_ = auVar141._0_10_;
      auVar108._10_2_ = uStack_450;
      auVar107._10_6_ = auVar108._10_6_;
      auVar107._0_8_ = auVar141._0_8_;
      auVar107._8_2_ = auVar141._4_2_;
      auVar113._8_8_ = auVar107._8_8_;
      auVar113._6_2_ = uStack_454;
      auVar113._4_2_ = auVar141._2_2_;
      auVar113._2_2_ = local_458;
      local_468._2_2_ = puVar9[4];
      local_468._0_2_ = auVar141._8_2_;
      local_468._4_2_ = auVar141._10_2_;
      local_468._6_2_ = puVar9[5];
      local_468._8_2_ = auVar141._12_2_;
      local_468._10_2_ = puVar9[6];
      local_468._12_2_ = auVar141._14_2_;
      local_468._14_2_ = puVar9[7];
      uStack_44a = auVar112._6_2_;
      uStack_44e = auVar112._4_2_;
      uStack_452 = auVar112._2_2_;
      auVar156._0_2_ = auVar112._0_2_;
      auVar164._2_2_ = auVar112._8_2_;
      auVar164._0_2_ = puVar9[4];
      auVar164._4_2_ = puVar9[5];
      auVar164._6_2_ = auVar112._10_2_;
      auVar164._8_2_ = puVar9[6];
      auVar164._10_2_ = auVar112._12_2_;
      auVar164._12_2_ = puVar9[7];
      auVar164._14_2_ = auVar112._14_2_;
      auVar159._0_12_ = auVar112._0_12_;
      auVar159._12_2_ = uStack_44a;
      auVar159._14_2_ = puVar10[3];
      auVar158._12_4_ = auVar159._12_4_;
      auVar158._0_10_ = auVar112._0_10_;
      auVar158._10_2_ = puVar10[2];
      auVar157._10_6_ = auVar158._10_6_;
      auVar157._0_8_ = auVar112._0_8_;
      auVar157._8_2_ = uStack_44e;
      auVar156._8_8_ = auVar157._8_8_;
      auVar156._6_2_ = puVar10[1];
      auVar156._4_2_ = uStack_452;
      auVar156._2_2_ = *puVar10;
      auVar141._2_2_ = puVar10[4];
      auVar141._0_2_ = auVar112._8_2_;
      auVar141._4_2_ = auVar112._10_2_;
      auVar141._6_2_ = puVar10[5];
      auVar141._8_2_ = auVar112._12_2_;
      auVar141._10_2_ = puVar10[6];
      auVar141._12_2_ = auVar112._14_2_;
      auVar141._14_2_ = puVar10[7];
      local_428._2_2_ = auVar118._0_2_;
      local_428._0_2_ = *puVar10;
      local_428._4_2_ = puVar10[1];
      local_428._6_2_ = auVar118._2_2_;
      local_428._8_2_ = puVar10[2];
      local_428._10_2_ = auVar118._4_2_;
      local_428._12_2_ = puVar10[3];
      local_428._14_2_ = auVar118._6_2_;
      auVar140._2_2_ = auVar118._8_2_;
      auVar140._0_2_ = puVar10[4];
      auVar140._4_2_ = puVar10[5];
      auVar140._6_2_ = auVar118._10_2_;
      auVar140._8_2_ = puVar10[6];
      auVar140._10_2_ = auVar118._12_2_;
      auVar140._12_2_ = puVar10[7];
      auVar140._14_2_ = auVar118._14_2_;
      puVar97 = local_440;
      puVar99 = src;
      uStack_456 = auVar156._0_2_;
      for (lVar101 = 0; auVar107 = auVar141, auVar108 = auVar140, auVar112 = auVar113, lVar101 < h;
          lVar101 = lVar101 + 2) {
        auVar113 = *(undefined1 (*) [16])((long)puVar99 + lVar104);
        pauVar11 = (undefined1 (*) [16])((long)puVar99 + lVar100);
        auVar109 = *pauVar11;
        auVar163._0_12_ = auVar118._0_12_;
        auVar163._12_2_ = auVar118._6_2_;
        auVar163._14_2_ = auVar113._6_2_;
        auVar162._12_4_ = auVar163._12_4_;
        auVar162._0_10_ = auVar118._0_10_;
        auVar162._10_2_ = auVar113._4_2_;
        auVar161._10_6_ = auVar162._10_6_;
        auVar161._0_8_ = auVar118._0_8_;
        auVar161._8_2_ = auVar118._4_2_;
        auVar160._8_8_ = auVar161._8_8_;
        auVar160._6_2_ = auVar113._2_2_;
        auVar160._4_2_ = auVar118._2_2_;
        auVar160._0_2_ = auVar118._0_2_;
        auVar160._2_2_ = auVar113._0_2_;
        auVar154._0_12_ = auVar113._0_12_;
        auVar154._12_2_ = auVar113._6_2_;
        auVar154._14_2_ = *(undefined2 *)(*pauVar11 + 6);
        auVar153._12_4_ = auVar154._12_4_;
        auVar153._0_10_ = auVar113._0_10_;
        auVar153._10_2_ = *(undefined2 *)(*pauVar11 + 4);
        auVar152._10_6_ = auVar153._10_6_;
        auVar152._0_8_ = auVar113._0_8_;
        auVar152._8_2_ = auVar113._4_2_;
        auVar151._8_8_ = auVar152._8_8_;
        auVar151._6_2_ = *(undefined2 *)(*pauVar11 + 2);
        auVar151._4_2_ = auVar113._2_2_;
        auVar151._2_2_ = *(undefined2 *)*pauVar11;
        auVar151._0_2_ = auVar113._0_2_;
        auVar33._4_2_ = uStack_374;
        auVar33._0_4_ = uVar111;
        auVar33._6_2_ = uStack_372;
        auVar33._8_2_ = uStack_374;
        auVar33._10_2_ = uStack_372;
        auVar33._12_2_ = uStack_374;
        auVar33._14_2_ = uStack_372;
        auVar147 = pmaddwd(auVar139,auVar33);
        auVar32._4_2_ = uStack_384;
        auVar32._0_4_ = uVar28;
        auVar32._6_2_ = uStack_382;
        auVar32._8_2_ = uStack_384;
        auVar32._10_2_ = uStack_382;
        auVar32._12_2_ = uStack_384;
        auVar32._14_2_ = uStack_382;
        auVar142 = pmaddwd(auVar112,auVar32);
        auVar31._4_2_ = uStack_394;
        auVar31._0_4_ = uVar29;
        auVar31._6_2_ = uStack_392;
        auVar31._8_2_ = uStack_394;
        auVar31._10_2_ = uStack_392;
        auVar31._12_2_ = uStack_394;
        auVar31._14_2_ = uStack_392;
        auVar148 = pmaddwd(auVar156,auVar31);
        auVar143 = pmaddwd(auVar160,auVar105);
        auVar138 = pmaddwd(auVar138,auVar33);
        auVar30._2_2_ = uStack_456;
        auVar30._0_2_ = local_458;
        auVar30._4_2_ = uStack_454;
        auVar30._6_2_ = uStack_452;
        auVar30._8_2_ = uStack_450;
        auVar30._10_2_ = uStack_44e;
        auVar30._12_2_ = uStack_44c;
        auVar30._14_2_ = uStack_44a;
        auVar144 = pmaddwd(auVar30,auVar32);
        auVar139 = pmaddwd(local_428,auVar31);
        auVar145 = pmaddwd(auVar151,auVar105);
        auVar141._2_2_ = auVar113._8_2_;
        auVar141._0_2_ = auVar118._8_2_;
        auVar141._4_2_ = auVar118._10_2_;
        auVar141._6_2_ = auVar113._10_2_;
        auVar141._8_2_ = auVar118._12_2_;
        auVar141._10_2_ = auVar113._12_2_;
        auVar141._12_2_ = auVar118._14_2_;
        auVar141._14_2_ = auVar113._14_2_;
        auVar140._2_2_ = *(undefined2 *)(*pauVar11 + 8);
        auVar140._0_2_ = auVar113._8_2_;
        auVar140._4_2_ = auVar113._10_2_;
        auVar140._6_2_ = *(undefined2 *)(*pauVar11 + 10);
        auVar140._8_2_ = auVar113._12_2_;
        auVar140._10_2_ = *(undefined2 *)(*pauVar11 + 0xc);
        auVar140._12_2_ = auVar113._14_2_;
        auVar140._14_2_ = *(undefined2 *)(*pauVar11 + 0xe);
        auVar149._0_4_ =
             auVar148._0_4_ + auVar142._0_4_ + auVar147._0_4_ + 0x40 + auVar143._0_4_ >> 7;
        auVar149._4_4_ =
             auVar148._4_4_ + auVar142._4_4_ + auVar147._4_4_ + 0x40 + auVar143._4_4_ >> 7;
        auVar149._8_4_ =
             auVar148._8_4_ + auVar142._8_4_ + auVar147._8_4_ + 0x40 + auVar143._8_4_ >> 7;
        auVar149._12_4_ =
             auVar148._12_4_ + auVar142._12_4_ + auVar147._12_4_ + 0x40 + auVar143._12_4_ >> 7;
        auVar118._0_4_ =
             auVar139._0_4_ + auVar144._0_4_ + auVar138._0_4_ + 0x40 + auVar145._0_4_ >> 7;
        auVar118._4_4_ =
             auVar139._4_4_ + auVar144._4_4_ + auVar138._4_4_ + 0x40 + auVar145._4_4_ >> 7;
        auVar118._8_4_ =
             auVar139._8_4_ + auVar144._8_4_ + auVar138._8_4_ + 0x40 + auVar145._8_4_ >> 7;
        auVar118._12_4_ =
             auVar139._12_4_ + auVar144._12_4_ + auVar138._12_4_ + 0x40 + auVar145._12_4_ >> 7;
        if (lVar98 < (long)w + -4) {
          auVar138 = pmaddwd(auVar119,auVar33);
          auVar119 = pmaddwd(local_468,auVar32);
          auVar113 = pmaddwd(auVar107,auVar31);
          auVar139 = pmaddwd(auVar141,auVar105);
          auVar143 = pmaddwd(auVar120,auVar33);
          auVar120 = pmaddwd(auVar164,auVar32);
          auVar144 = pmaddwd(auVar108,auVar31);
          auVar142 = pmaddwd(auVar140,auVar105);
          auVar114._0_4_ =
               auVar113._0_4_ + auVar119._0_4_ + auVar138._0_4_ + 0x40 + auVar139._0_4_ >> 7;
          auVar114._4_4_ =
               auVar113._4_4_ + auVar119._4_4_ + auVar138._4_4_ + 0x40 + auVar139._4_4_ >> 7;
          auVar114._8_4_ =
               auVar113._8_4_ + auVar119._8_4_ + auVar138._8_4_ + 0x40 + auVar139._8_4_ >> 7;
          auVar114._12_4_ =
               auVar113._12_4_ + auVar119._12_4_ + auVar138._12_4_ + 0x40 + auVar139._12_4_ >> 7;
          auVar113 = packssdw(auVar149,auVar114);
          auVar165._0_4_ =
               auVar144._0_4_ + auVar120._0_4_ + auVar143._0_4_ + 0x40 + auVar142._0_4_ >> 7;
          auVar165._4_4_ =
               auVar144._4_4_ + auVar120._4_4_ + auVar143._4_4_ + 0x40 + auVar142._4_4_ >> 7;
          auVar165._8_4_ =
               auVar144._8_4_ + auVar120._8_4_ + auVar143._8_4_ + 0x40 + auVar142._8_4_ >> 7;
          auVar165._12_4_ =
               auVar144._12_4_ + auVar120._12_4_ + auVar143._12_4_ + 0x40 + auVar142._12_4_ >> 7;
          auVar138 = packssdw(auVar118,auVar165);
          sVar110 = auVar113._0_2_;
          uVar115 = (ushort)(sStack_310 < sVar110) * sStack_310 |
                    (ushort)(sStack_310 >= sVar110) * sVar110;
          sVar110 = auVar113._2_2_;
          uVar116 = (ushort)(sStack_30e < sVar110) * sStack_30e |
                    (ushort)(sStack_30e >= sVar110) * sVar110;
          sVar110 = auVar113._4_2_;
          uVar121 = (ushort)(sStack_310 < sVar110) * sStack_310 |
                    (ushort)(sStack_310 >= sVar110) * sVar110;
          sVar110 = auVar113._6_2_;
          uVar122 = (ushort)(sStack_30e < sVar110) * sStack_30e |
                    (ushort)(sStack_30e >= sVar110) * sVar110;
          sVar110 = auVar113._8_2_;
          uVar123 = (ushort)(sStack_310 < sVar110) * sStack_310 |
                    (ushort)(sStack_310 >= sVar110) * sVar110;
          sVar110 = auVar113._10_2_;
          uVar124 = (ushort)(sStack_30e < sVar110) * sStack_30e |
                    (ushort)(sStack_30e >= sVar110) * sVar110;
          sVar110 = auVar113._12_2_;
          sVar135 = auVar113._14_2_;
          uVar125 = (ushort)(sStack_310 < sVar110) * sStack_310 |
                    (ushort)(sStack_310 >= sVar110) * sVar110;
          uVar126 = (ushort)(sStack_30e < sVar135) * sStack_30e |
                    (ushort)(sStack_30e >= sVar135) * sVar135;
          *puVar97 = (-1 < (short)uVar115) * uVar115;
          puVar97[1] = (-1 < (short)uVar116) * uVar116;
          puVar97[2] = (-1 < (short)uVar121) * uVar121;
          puVar97[3] = (-1 < (short)uVar122) * uVar122;
          puVar97[4] = (-1 < (short)uVar123) * uVar123;
          puVar97[5] = (-1 < (short)uVar124) * uVar124;
          puVar97[6] = (-1 < (short)uVar125) * uVar125;
          puVar97[7] = (-1 < (short)uVar126) * uVar126;
          sVar110 = auVar138._0_2_;
          uVar115 = (ushort)(sStack_310 < sVar110) * sStack_310 |
                    (ushort)(sStack_310 >= sVar110) * sVar110;
          sVar110 = auVar138._2_2_;
          uVar116 = (ushort)(sStack_30e < sVar110) * sStack_30e |
                    (ushort)(sStack_30e >= sVar110) * sVar110;
          sVar110 = auVar138._4_2_;
          uVar121 = (ushort)(sStack_310 < sVar110) * sStack_310 |
                    (ushort)(sStack_310 >= sVar110) * sVar110;
          sVar110 = auVar138._6_2_;
          uVar122 = (ushort)(sStack_30e < sVar110) * sStack_30e |
                    (ushort)(sStack_30e >= sVar110) * sVar110;
          sVar110 = auVar138._8_2_;
          uVar123 = (ushort)(sStack_310 < sVar110) * sStack_310 |
                    (ushort)(sStack_310 >= sVar110) * sVar110;
          sVar110 = auVar138._10_2_;
          uVar124 = (ushort)(sStack_30e < sVar110) * sStack_30e |
                    (ushort)(sStack_30e >= sVar110) * sVar110;
          sVar110 = auVar138._12_2_;
          sVar135 = auVar138._14_2_;
          uVar125 = (ushort)(sStack_310 < sVar110) * sStack_310 |
                    (ushort)(sStack_310 >= sVar110) * sVar110;
          uVar126 = (ushort)(sStack_30e < sVar135) * sStack_30e |
                    (ushort)(sStack_30e >= sVar135) * sVar135;
          puVar7 = puVar97 + lVar95;
          *puVar7 = (-1 < (short)uVar115) * uVar115;
          puVar7[1] = (-1 < (short)uVar116) * uVar116;
          puVar7[2] = (-1 < (short)uVar121) * uVar121;
          puVar7[3] = (-1 < (short)uVar122) * uVar122;
          puVar7[4] = (-1 < (short)uVar123) * uVar123;
          puVar7[5] = (-1 < (short)uVar124) * uVar124;
          puVar7[6] = (-1 < (short)uVar125) * uVar125;
          puVar7[7] = (-1 < (short)uVar126) * uVar126;
        }
        else {
          auVar138 = packssdw(auVar149,auVar149);
          sVar110 = auVar138._0_2_;
          uVar115 = (ushort)(sStack_310 < sVar110) * sStack_310 |
                    (ushort)(sStack_310 >= sVar110) * sVar110;
          sVar110 = auVar138._2_2_;
          uVar116 = (ushort)(sStack_30e < sVar110) * sStack_30e |
                    (ushort)(sStack_30e >= sVar110) * sVar110;
          sVar110 = auVar138._4_2_;
          uVar123 = (ushort)(sStack_310 < sVar110) * sStack_310 |
                    (ushort)(sStack_310 >= sVar110) * sVar110;
          sVar110 = auVar138._6_2_;
          uVar124 = (ushort)(sStack_30e < sVar110) * sStack_30e |
                    (ushort)(sStack_30e >= sVar110) * sVar110;
          uVar146 = CONCAT22((-1 < (short)uVar116) * uVar116,(-1 < (short)uVar115) * uVar115);
          auVar138 = packssdw(auVar118,auVar118);
          sVar110 = auVar138._0_2_;
          uVar115 = (ushort)(sStack_310 < sVar110) * sStack_310 |
                    (ushort)(sStack_310 >= sVar110) * sVar110;
          sVar110 = auVar138._2_2_;
          uVar116 = (ushort)(sStack_30e < sVar110) * sStack_30e |
                    (ushort)(sStack_30e >= sVar110) * sVar110;
          sVar110 = auVar138._4_2_;
          uVar121 = (ushort)(sStack_310 < sVar110) * sStack_310 |
                    (ushort)(sStack_310 >= sVar110) * sVar110;
          sVar110 = auVar138._6_2_;
          uVar122 = (ushort)(sStack_30e < sVar110) * sStack_30e |
                    (ushort)(sStack_30e >= sVar110) * sVar110;
          uVar137 = CONCAT22((-1 < (short)uVar116) * uVar116,(-1 < (short)uVar115) * uVar115);
          if (w == 4) {
            *(ulong *)puVar97 =
                 CONCAT26((-1 < (short)uVar124) * uVar124,
                          CONCAT24((-1 < (short)uVar123) * uVar123,uVar146));
            *(ulong *)(puVar97 + lVar95) =
                 CONCAT26((-1 < (short)uVar122) * uVar122,
                          CONCAT24((-1 < (short)uVar121) * uVar121,uVar137));
          }
          else {
            *(undefined4 *)puVar97 = uVar146;
            *(undefined4 *)(puVar97 + lVar95) = uVar137;
          }
        }
        puVar99 = puVar99 + (long)src_stride * 2;
        puVar97 = puVar97 + lVar95 * 2;
        auVar138._2_2_ = uStack_456;
        auVar138._0_2_ = local_458;
        auVar138._4_2_ = uStack_454;
        auVar138._6_2_ = uStack_452;
        auVar138._8_2_ = uStack_450;
        auVar138._10_2_ = uStack_44e;
        auVar138._12_2_ = uStack_44c;
        auVar138._14_2_ = uStack_44a;
        local_458 = local_428._0_2_;
        uStack_456 = local_428._2_2_;
        uStack_454 = local_428._4_2_;
        uStack_452 = local_428._6_2_;
        uStack_450 = local_428._8_2_;
        uStack_44e = local_428._10_2_;
        uStack_44c = local_428._12_2_;
        uStack_44a = local_428._14_2_;
        auVar113 = auVar156;
        auVar119 = local_468;
        auVar118 = auVar109;
        auVar120 = auVar164;
        auVar139 = auVar112;
        auVar156 = auVar160;
        auVar164 = auVar108;
        local_468 = auVar107;
        local_428 = auVar151;
      }
      lVar100 = lVar100 + 0x10;
      lVar104 = lVar104 + 0x10;
      local_440 = local_440 + 8;
    }
  }
  return;
}

Assistant:

void av1_highbd_convolve_y_sr_ssse3(const uint16_t *src, int src_stride,
                                    uint16_t *dst, int dst_stride, int w, int h,
                                    const InterpFilterParams *filter_params_y,
                                    const int subpel_y_qn, int bd) {
  int i, j;
  const int fo_vert = filter_params_y->taps / 2 - 1;
  const uint16_t *const src_ptr = src - fo_vert * src_stride;
  const int bits = FILTER_BITS;

  const __m128i round_shift_bits = _mm_cvtsi32_si128(bits);
  const __m128i round_const_bits = _mm_set1_epi32((1 << bits) >> 1);
  const __m128i clip_pixel =
      _mm_set1_epi16(bd == 10 ? 1023 : (bd == 12 ? 4095 : 255));
  const __m128i zero = _mm_setzero_si128();
  if (filter_params_y->taps == 12) {
    __m128i s[24], coeffs_y[6];

    prepare_coeffs_12tap(filter_params_y, subpel_y_qn, coeffs_y);

    for (j = 0; j < w; j += 8) {
      const uint16_t *data = &src_ptr[j];
      /* Vertical filter */
      __m128i s0 = _mm_loadu_si128((__m128i *)(data + 0 * src_stride));
      __m128i s1 = _mm_loadu_si128((__m128i *)(data + 1 * src_stride));
      __m128i s2 = _mm_loadu_si128((__m128i *)(data + 2 * src_stride));
      __m128i s3 = _mm_loadu_si128((__m128i *)(data + 3 * src_stride));
      __m128i s4 = _mm_loadu_si128((__m128i *)(data + 4 * src_stride));
      __m128i s5 = _mm_loadu_si128((__m128i *)(data + 5 * src_stride));
      __m128i s6 = _mm_loadu_si128((__m128i *)(data + 6 * src_stride));
      __m128i s7 = _mm_loadu_si128((__m128i *)(data + 7 * src_stride));
      __m128i s8 = _mm_loadu_si128((__m128i *)(data + 8 * src_stride));
      __m128i s9 = _mm_loadu_si128((__m128i *)(data + 9 * src_stride));
      __m128i s10 = _mm_loadu_si128((__m128i *)(data + 10 * src_stride));

      s[0] = _mm_unpacklo_epi16(s0, s1);
      s[1] = _mm_unpacklo_epi16(s2, s3);
      s[2] = _mm_unpacklo_epi16(s4, s5);
      s[3] = _mm_unpacklo_epi16(s6, s7);
      s[4] = _mm_unpacklo_epi16(s8, s9);

      s[6] = _mm_unpackhi_epi16(s0, s1);
      s[7] = _mm_unpackhi_epi16(s2, s3);
      s[8] = _mm_unpackhi_epi16(s4, s5);
      s[9] = _mm_unpackhi_epi16(s6, s7);
      s[10] = _mm_unpackhi_epi16(s8, s9);

      s[12] = _mm_unpacklo_epi16(s1, s2);
      s[13] = _mm_unpacklo_epi16(s3, s4);
      s[14] = _mm_unpacklo_epi16(s5, s6);
      s[15] = _mm_unpacklo_epi16(s7, s8);
      s[16] = _mm_unpacklo_epi16(s9, s10);

      s[18] = _mm_unpackhi_epi16(s1, s2);
      s[19] = _mm_unpackhi_epi16(s3, s4);
      s[20] = _mm_unpackhi_epi16(s5, s6);
      s[21] = _mm_unpackhi_epi16(s7, s8);
      s[22] = _mm_unpackhi_epi16(s9, s10);

      for (i = 0; i < h; i += 2) {
        data = &src_ptr[i * src_stride + j];

        __m128i s11 = _mm_loadu_si128((__m128i *)(data + 11 * src_stride));
        __m128i s12 = _mm_loadu_si128((__m128i *)(data + 12 * src_stride));

        s[5] = _mm_unpacklo_epi16(s10, s11);
        s[11] = _mm_unpackhi_epi16(s10, s11);

        s[17] = _mm_unpacklo_epi16(s11, s12);
        s[23] = _mm_unpackhi_epi16(s11, s12);

        const __m128i res_a0 = convolve_12tap(s, coeffs_y);
        __m128i res_a_round0 = _mm_sra_epi32(
            _mm_add_epi32(res_a0, round_const_bits), round_shift_bits);

        const __m128i res_a1 = convolve_12tap(s + 12, coeffs_y);
        __m128i res_a_round1 = _mm_sra_epi32(
            _mm_add_epi32(res_a1, round_const_bits), round_shift_bits);

        if (w - j > 4) {
          const __m128i res_b0 = convolve_12tap(s + 6, coeffs_y);
          __m128i res_b_round0 = _mm_sra_epi32(
              _mm_add_epi32(res_b0, round_const_bits), round_shift_bits);

          const __m128i res_b1 = convolve_12tap(s + 18, coeffs_y);
          __m128i res_b_round1 = _mm_sra_epi32(
              _mm_add_epi32(res_b1, round_const_bits), round_shift_bits);

          __m128i res_16bit0 = _mm_packs_epi32(res_a_round0, res_b_round0);
          res_16bit0 = _mm_min_epi16(res_16bit0, clip_pixel);
          res_16bit0 = _mm_max_epi16(res_16bit0, zero);

          __m128i res_16bit1 = _mm_packs_epi32(res_a_round1, res_b_round1);
          res_16bit1 = _mm_min_epi16(res_16bit1, clip_pixel);
          res_16bit1 = _mm_max_epi16(res_16bit1, zero);

          _mm_storeu_si128((__m128i *)&dst[i * dst_stride + j], res_16bit0);
          _mm_storeu_si128((__m128i *)&dst[i * dst_stride + j + dst_stride],
                           res_16bit1);
        } else if (w == 4) {
          res_a_round0 = _mm_packs_epi32(res_a_round0, res_a_round0);
          res_a_round0 = _mm_min_epi16(res_a_round0, clip_pixel);
          res_a_round0 = _mm_max_epi16(res_a_round0, zero);

          res_a_round1 = _mm_packs_epi32(res_a_round1, res_a_round1);
          res_a_round1 = _mm_min_epi16(res_a_round1, clip_pixel);
          res_a_round1 = _mm_max_epi16(res_a_round1, zero);

          _mm_storel_epi64((__m128i *)&dst[i * dst_stride + j], res_a_round0);
          _mm_storel_epi64((__m128i *)&dst[i * dst_stride + j + dst_stride],
                           res_a_round1);
        } else {
          res_a_round0 = _mm_packs_epi32(res_a_round0, res_a_round0);
          res_a_round0 = _mm_min_epi16(res_a_round0, clip_pixel);
          res_a_round0 = _mm_max_epi16(res_a_round0, zero);

          res_a_round1 = _mm_packs_epi32(res_a_round1, res_a_round1);
          res_a_round1 = _mm_min_epi16(res_a_round1, clip_pixel);
          res_a_round1 = _mm_max_epi16(res_a_round1, zero);

          *((int *)(&dst[i * dst_stride + j])) =
              _mm_cvtsi128_si32(res_a_round0);

          *((int *)(&dst[i * dst_stride + j + dst_stride])) =
              _mm_cvtsi128_si32(res_a_round1);
        }

        s[0] = s[1];
        s[1] = s[2];
        s[2] = s[3];
        s[3] = s[4];
        s[4] = s[5];

        s[6] = s[7];
        s[7] = s[8];
        s[8] = s[9];
        s[9] = s[10];
        s[10] = s[11];

        s[12] = s[13];
        s[13] = s[14];
        s[14] = s[15];
        s[15] = s[16];
        s[16] = s[17];

        s[18] = s[19];
        s[19] = s[20];
        s[20] = s[21];
        s[21] = s[22];
        s[22] = s[23];

        s10 = s12;
      }
    }
  } else {
    __m128i s[16], coeffs_y[4];

    prepare_coeffs(filter_params_y, subpel_y_qn, coeffs_y);

    for (j = 0; j < w; j += 8) {
      const uint16_t *data = &src_ptr[j];
      /* Vertical filter */
      {
        __m128i s0 = _mm_loadu_si128((__m128i *)(data + 0 * src_stride));
        __m128i s1 = _mm_loadu_si128((__m128i *)(data + 1 * src_stride));
        __m128i s2 = _mm_loadu_si128((__m128i *)(data + 2 * src_stride));
        __m128i s3 = _mm_loadu_si128((__m128i *)(data + 3 * src_stride));
        __m128i s4 = _mm_loadu_si128((__m128i *)(data + 4 * src_stride));
        __m128i s5 = _mm_loadu_si128((__m128i *)(data + 5 * src_stride));
        __m128i s6 = _mm_loadu_si128((__m128i *)(data + 6 * src_stride));

        s[0] = _mm_unpacklo_epi16(s0, s1);
        s[1] = _mm_unpacklo_epi16(s2, s3);
        s[2] = _mm_unpacklo_epi16(s4, s5);

        s[4] = _mm_unpackhi_epi16(s0, s1);
        s[5] = _mm_unpackhi_epi16(s2, s3);
        s[6] = _mm_unpackhi_epi16(s4, s5);

        s[0 + 8] = _mm_unpacklo_epi16(s1, s2);
        s[1 + 8] = _mm_unpacklo_epi16(s3, s4);
        s[2 + 8] = _mm_unpacklo_epi16(s5, s6);

        s[4 + 8] = _mm_unpackhi_epi16(s1, s2);
        s[5 + 8] = _mm_unpackhi_epi16(s3, s4);
        s[6 + 8] = _mm_unpackhi_epi16(s5, s6);

        for (i = 0; i < h; i += 2) {
          data = &src_ptr[i * src_stride + j];

          __m128i s7 = _mm_loadu_si128((__m128i *)(data + 7 * src_stride));
          __m128i s8 = _mm_loadu_si128((__m128i *)(data + 8 * src_stride));

          s[3] = _mm_unpacklo_epi16(s6, s7);
          s[7] = _mm_unpackhi_epi16(s6, s7);

          s[3 + 8] = _mm_unpacklo_epi16(s7, s8);
          s[7 + 8] = _mm_unpackhi_epi16(s7, s8);

          const __m128i res_a0 = convolve(s, coeffs_y);
          __m128i res_a_round0 = _mm_sra_epi32(
              _mm_add_epi32(res_a0, round_const_bits), round_shift_bits);

          const __m128i res_a1 = convolve(s + 8, coeffs_y);
          __m128i res_a_round1 = _mm_sra_epi32(
              _mm_add_epi32(res_a1, round_const_bits), round_shift_bits);

          if (w - j > 4) {
            const __m128i res_b0 = convolve(s + 4, coeffs_y);
            __m128i res_b_round0 = _mm_sra_epi32(
                _mm_add_epi32(res_b0, round_const_bits), round_shift_bits);

            const __m128i res_b1 = convolve(s + 4 + 8, coeffs_y);
            __m128i res_b_round1 = _mm_sra_epi32(
                _mm_add_epi32(res_b1, round_const_bits), round_shift_bits);

            __m128i res_16bit0 = _mm_packs_epi32(res_a_round0, res_b_round0);
            res_16bit0 = _mm_min_epi16(res_16bit0, clip_pixel);
            res_16bit0 = _mm_max_epi16(res_16bit0, zero);

            __m128i res_16bit1 = _mm_packs_epi32(res_a_round1, res_b_round1);
            res_16bit1 = _mm_min_epi16(res_16bit1, clip_pixel);
            res_16bit1 = _mm_max_epi16(res_16bit1, zero);

            _mm_storeu_si128((__m128i *)&dst[i * dst_stride + j], res_16bit0);
            _mm_storeu_si128((__m128i *)&dst[i * dst_stride + j + dst_stride],
                             res_16bit1);
          } else if (w == 4) {
            res_a_round0 = _mm_packs_epi32(res_a_round0, res_a_round0);
            res_a_round0 = _mm_min_epi16(res_a_round0, clip_pixel);
            res_a_round0 = _mm_max_epi16(res_a_round0, zero);

            res_a_round1 = _mm_packs_epi32(res_a_round1, res_a_round1);
            res_a_round1 = _mm_min_epi16(res_a_round1, clip_pixel);
            res_a_round1 = _mm_max_epi16(res_a_round1, zero);

            _mm_storel_epi64((__m128i *)&dst[i * dst_stride + j], res_a_round0);
            _mm_storel_epi64((__m128i *)&dst[i * dst_stride + j + dst_stride],
                             res_a_round1);
          } else {
            res_a_round0 = _mm_packs_epi32(res_a_round0, res_a_round0);
            res_a_round0 = _mm_min_epi16(res_a_round0, clip_pixel);
            res_a_round0 = _mm_max_epi16(res_a_round0, zero);

            res_a_round1 = _mm_packs_epi32(res_a_round1, res_a_round1);
            res_a_round1 = _mm_min_epi16(res_a_round1, clip_pixel);
            res_a_round1 = _mm_max_epi16(res_a_round1, zero);

            *((int *)(&dst[i * dst_stride + j])) =
                _mm_cvtsi128_si32(res_a_round0);

            *((int *)(&dst[i * dst_stride + j + dst_stride])) =
                _mm_cvtsi128_si32(res_a_round1);
          }

          s[0] = s[1];
          s[1] = s[2];
          s[2] = s[3];

          s[4] = s[5];
          s[5] = s[6];
          s[6] = s[7];

          s[0 + 8] = s[1 + 8];
          s[1 + 8] = s[2 + 8];
          s[2 + 8] = s[3 + 8];

          s[4 + 8] = s[5 + 8];
          s[5 + 8] = s[6 + 8];
          s[6 + 8] = s[7 + 8];

          s6 = s8;
        }
      }
    }
  }
}